

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  Colour colourGuard;
  
  TagAliasRegistry::get();
  TagAliasRegistry::add(&TagAliasRegistry::get::instance,alias,tag,lineInfo);
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {
        try {
            TagAliasRegistry::get().add( alias, tag, lineInfo );
        }
        catch( std::exception& ex ) {
            Colour colourGuard( Colour::Red );
            std::cerr << ex.what() << std::endl;
            exit(1);
        }
    }